

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ReduceLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reduce(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x118) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x118;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    ReduceLayerParams::ReduceLayerParams(this_00.reduce_);
    (this->layer_).reduce_ = (ReduceLayerParams *)this_00;
  }
  return (ReduceLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceLayerParams* NeuralNetworkLayer::mutable_reduce() {
  if (!has_reduce()) {
    clear_layer();
    set_has_reduce();
    layer_.reduce_ = new ::CoreML::Specification::ReduceLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduce)
  return layer_.reduce_;
}